

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_RevSurface::GetSpanVector(ON_RevSurface *this,int dir,double *s)

{
  ON_Interval *this_00;
  ON_Curve *pOVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  
  iVar4 = 1 - dir;
  if (this->m_bTransposed == false) {
    iVar4 = dir;
  }
  if (iVar4 == 1) {
    pOVar1 = this->m_curve;
    if (pOVar1 != (ON_Curve *)0x0) {
      iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2a])(pOVar1,s);
      return SUB41(iVar4,0);
    }
  }
  else if (iVar4 == 0) {
    this_00 = &this->m_t;
    bVar2 = ON_Interval::IsIncreasing(this_00);
    if ((bVar2) &&
       (uVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])
                          (this), 0 < (int)uVar3)) {
      dVar6 = ON_Interval::operator[](this_00,0);
      *s = dVar6;
      for (uVar5 = 1; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        dVar6 = ON_Interval::ParameterAt(this_00,(double)(int)uVar5 * (1.0 / (double)(int)uVar3));
        s[uVar5] = dVar6;
      }
      dVar6 = ON_Interval::operator[](this_00,1);
      s[uVar3] = dVar6;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_RevSurface::GetSpanVector( int dir, double* s ) const
{
  bool rc = false;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir==0 && m_t.IsIncreasing() ) {
    int span_count = SpanCount(m_bTransposed?1-dir:dir);
    if ( span_count > 0 )
    {
      double d = 1.0/span_count;
      s[0] = m_t[0];
      for ( int i = 1; i < span_count; i++ )
        s[i] = m_t.ParameterAt( i*d );
      s[span_count] = m_t[1];
      rc = true;
    }
  }
  else if ( dir==1 && m_curve ) {
    rc = m_curve->GetSpanVector(s);
  }
  return rc;
}